

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

void __thiscall jrtplib::RTPUDPv6Transmitter::ClearDestinations(RTPUDPv6Transmitter *this)

{
  HashElement *pHVar1;
  RTPMemoryManager *pRVar2;
  HashElement *pHVar3;
  
  if ((this->init == true) && (this->created == true)) {
    memset((this->destinations).table,0,0x103e8);
    pHVar3 = (this->destinations).firsthashelem;
    while (pHVar3 != (HashElement *)0x0) {
      pHVar1 = pHVar3->listnext;
      pRVar2 = (this->destinations).super_RTPMemoryObject.mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        operator_delete(pHVar3,0x60);
        pHVar3 = pHVar1;
      }
      else {
        (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pHVar3);
        pHVar3 = pHVar1;
      }
    }
    (this->destinations).firsthashelem = (HashElement *)0x0;
    (this->destinations).lasthashelem = (HashElement *)0x0;
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::ClearDestinations()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created)
		destinations.Clear();
	MAINMUTEX_UNLOCK
}